

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorPoolDatabase::FindFileContainingExtension
          (DescriptorPoolDatabase *this,string *containing_type,int field_number,
          FileDescriptorProto *output)

{
  Descriptor *extendee_00;
  FieldDescriptor *this_00;
  FileDescriptor *this_01;
  FieldDescriptor *extension;
  Descriptor *extendee;
  FileDescriptorProto *output_local;
  int field_number_local;
  string *containing_type_local;
  DescriptorPoolDatabase *this_local;
  
  extendee_00 = DescriptorPool::FindMessageTypeByName(this->pool_,containing_type);
  if (extendee_00 == (Descriptor *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    this_00 = DescriptorPool::FindExtensionByNumber(this->pool_,extendee_00,field_number);
    if (this_00 == (FieldDescriptor *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      (*(output->super_Message).super_MessageLite._vptr_MessageLite[4])();
      this_01 = FieldDescriptor::file(this_00);
      FileDescriptor::CopyTo(this_01,output);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool DescriptorPoolDatabase::FindFileContainingExtension(
    const string& containing_type,
    int field_number,
    FileDescriptorProto* output) {
  const Descriptor* extendee = pool_.FindMessageTypeByName(containing_type);
  if (extendee == NULL) return false;

  const FieldDescriptor* extension =
    pool_.FindExtensionByNumber(extendee, field_number);
  if (extension == NULL) return false;

  output->Clear();
  extension->file()->CopyTo(output);
  return true;
}